

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

SearchResult<unsigned_long,_true> __thiscall
absl::lts_20250127::container_internal::
btree_node<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>
::
binary_search_impl<std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::container_internal::StringBtreeDefaultLess>
          (btree_node<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>
           *this,string_view *k,size_type s,StringBtreeDefaultLess *e,StringBtreeDefaultLess *comp)

{
  string_view lhs;
  bool bVar1;
  key_type *pkVar2;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  SearchResult<unsigned_long,_true> SVar3;
  OnlyLiteralZero local_7c;
  value_type local_7b;
  OnlyLiteralZero local_7a;
  value_type local_79;
  size_t local_78;
  char *local_70;
  size_t local_68;
  char *local_60;
  value_type local_51;
  StringBtreeDefaultLess *pSStack_50;
  weak_ordering c;
  size_type mid;
  StringBtreeDefaultLess *comp_local;
  size_type e_local;
  size_type s_local;
  basic_string_view<char,_std::char_traits<char>_> *k_local;
  btree_node<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
  *this_local;
  StringBtreeDefaultLess *local_18;
  undefined1 local_10;
  
  comp_local = e;
  e_local = s;
LAB_002ecfa7:
  do {
    if ((StringBtreeDefaultLess *)e_local == comp_local) {
      local_18 = (StringBtreeDefaultLess *)e_local;
      local_10 = 1;
LAB_002ed096:
      SVar3._9_7_ = (undefined7)(s >> 8);
      SVar3.match = local_10;
      SVar3.value = (unsigned_long)local_18;
      return SVar3;
    }
    pSStack_50 = (StringBtreeDefaultLess *)((ulong)(comp_local + e_local) >> 1);
    pkVar2 = btree_node<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
             ::key((btree_node<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
                    *)this,(size_type)pSStack_50);
    local_68 = pkVar2->_M_len;
    local_60 = pkVar2->_M_str;
    lhs._M_len = pkVar2->_M_len;
    lhs._M_str = pkVar2->_M_str;
    local_78 = k->_M_len;
    local_70 = k->_M_str;
    local_79 = (value_type)StringBtreeDefaultLess::operator()(comp,lhs,*k);
    local_51 = local_79;
    compare_internal::OnlyLiteralZero::OnlyLiteralZero(&local_7a,0);
    bVar1 = lts_20250127::operator<(local_79);
    if (!bVar1) {
      local_7b = local_51;
      compare_internal::OnlyLiteralZero::OnlyLiteralZero(&local_7c,0);
      bVar1 = operator>(local_7b);
      s = extraout_RDX_00;
      if (!bVar1) {
        local_18 = pSStack_50;
        local_10 = 0;
        goto LAB_002ed096;
      }
      comp_local = pSStack_50;
      goto LAB_002ecfa7;
    }
    e_local = (size_type)(pSStack_50 + 1);
    s = extraout_RDX;
  } while( true );
}

Assistant:

SearchResult<size_type, true> binary_search_impl(
      const K &k, size_type s, size_type e, const CompareTo &comp,
      std::true_type /* IsCompareTo */) const {
    if (params_type::template can_have_multiple_equivalent_keys<K>()) {
      MatchKind exact_match = MatchKind::kNe;
      while (s != e) {
        const size_type mid = (s + e) >> 1;
        const absl::weak_ordering c = comp(key(mid), k);
        if (c < 0) {
          s = mid + 1;
        } else {
          e = mid;
          if (c == 0) {
            // Need to return the first value whose key is not less than k,
            // which requires continuing the binary search if there could be
            // multiple equivalent keys.
            exact_match = MatchKind::kEq;
          }
        }
      }
      return {s, exact_match};
    } else {  // Can't have multiple equivalent keys.
      while (s != e) {
        const size_type mid = (s + e) >> 1;
        const absl::weak_ordering c = comp(key(mid), k);
        if (c < 0) {
          s = mid + 1;
        } else if (c > 0) {
          e = mid;
        } else {
          return {mid, MatchKind::kEq};
        }
      }
      return {s, MatchKind::kNe};
    }
  }